

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O0

Scalar * __thiscall
Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]
          (Matrix_Sparse_Row<Disa::Matrix_Sparse> *this,size_t *i_column)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  source_location *in_RCX;
  iterator_element local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  size_t *local_18;
  size_t *i_column_local;
  Matrix_Sparse_Row<Disa::Matrix_Sparse> *this_local;
  
  local_18 = i_column;
  i_column_local = (size_t *)this;
  bVar1 = Matrix_Sparse::contains(this->matrix,&this->row_index,i_column);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001f69f8;
    console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,in_RCX);
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    Matrix_Sparse::row_column_abi_cxx11_
              (&local_b0,(Matrix_Sparse *)this->row_index,*local_18,(size_t)in_RCX);
    std::operator+(&local_90,"Trying to access a zero element at [",&local_b0);
    std::operator+(&local_70,&local_90,"].");
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_38);
    exit(1);
  }
  Matrix_Sparse::find(&local_d0,this->matrix,&this->row_index,local_18);
  pvVar3 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator*<Disa::Matrix_Sparse,_true>
                     (&local_d0);
  return pvVar3;
}

Assistant:

constexpr const Scalar& operator[](const std::size_t& i_column) const {
    ASSERT_DEBUG(matrix->contains(row_index, i_column),
                 "Trying to access a zero element at [" + matrix->row_column(row_index, i_column) + "].");
    return *matrix->find(row_index, i_column);
  }